

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O0

void __thiscall Assimp::STLExporter::WritePointCloud(STLExporter *this,string *name,aiScene *pScene)

{
  long lVar1;
  ostream *poVar2;
  float *pfVar3;
  aiVector3D *v;
  uint a;
  aiMesh *mesh;
  uint i;
  aiVector3D nor;
  aiScene *pScene_local;
  string *name_local;
  STLExporter *this_local;
  
  nor._4_8_ = pScene;
  poVar2 = std::operator<<((ostream *)this," ");
  poVar2 = std::operator<<(poVar2,SolidToken);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::operator<<(poVar2,(string *)&this->endl);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&mesh + 4));
  poVar2 = std::operator<<((ostream *)this," facet normal ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,mesh._4_4_);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)i);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,nor.x);
  std::operator<<(poVar2,(string *)&this->endl);
  for (mesh._0_4_ = 0; (uint)mesh < *(uint *)(nor._4_8_ + 0x10); mesh._0_4_ = (uint)mesh + 1) {
    lVar1 = *(long *)(*(long *)(nor._4_8_ + 0x18) + (ulong)(uint)mesh * 8);
    if (lVar1 != 0) {
      for (v._4_4_ = 0; v._4_4_ < *(uint *)(lVar1 + 4); v._4_4_ = v._4_4_ + 1) {
        pfVar3 = (float *)(*(long *)(lVar1 + 0x10) + (ulong)v._4_4_ * 0xc);
        poVar2 = std::operator<<((ostream *)this,"  vertex ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pfVar3);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pfVar3[1]);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pfVar3[2]);
        std::operator<<(poVar2,(string *)&this->endl);
        poVar2 = std::operator<<((ostream *)this,"  vertex ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pfVar3);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pfVar3[1]);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pfVar3[2]);
        std::operator<<(poVar2,(string *)&this->endl);
        poVar2 = std::operator<<((ostream *)this,"  vertex ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pfVar3);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pfVar3[1]);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,pfVar3[2]);
        std::operator<<(poVar2,(string *)&this->endl);
      }
    }
  }
  poVar2 = std::operator<<((ostream *)this,EndSolidToken);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::operator<<(poVar2,(string *)&this->endl);
  return;
}

Assistant:

void STLExporter::WritePointCloud(const std::string &name, const aiScene* pScene) {
    mOutput << " " << SolidToken << " " << name << endl;
    aiVector3D nor;
    mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiMesh *mesh = pScene->mMeshes[i];
        if (nullptr == mesh) {
            continue;
        }

        for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {
            const aiVector3D& v = mesh->mVertices[a];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }
    }
    mOutput << EndSolidToken << " " << name << endl;
}